

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# incbet.c
# Opt level: O2

double hcephes_pseries(double a,double b,double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar5 = (1.0 - b) * x;
  dVar1 = dVar5 / (a + 1.0);
  dVar2 = 0.0;
  dVar3 = 2.0;
  dVar4 = dVar1;
  while ((1.0 / a) * 1.1102230246251565e-16 < ABS(dVar4)) {
    dVar5 = dVar5 * (((dVar3 - b) * x) / dVar3);
    dVar4 = dVar5 / (dVar3 + a);
    dVar2 = dVar2 + dVar4;
    dVar3 = dVar3 + 1.0;
  }
  dVar2 = 1.0 / a + dVar1 + dVar2;
  dVar4 = log(x);
  dVar1 = a + b;
  if ((171.6243769563027 <= dVar1) || (709.782712893384 <= ABS(dVar4 * a))) {
    dVar1 = hcephes_lgam(dVar1);
    dVar3 = hcephes_lgam(a);
    dVar5 = hcephes_lgam(b);
    dVar2 = log(dVar2);
    dVar2 = dVar2 + dVar4 * a + ((dVar1 - dVar3) - dVar5);
    dVar4 = 0.0;
    if (-745.1332191019412 <= dVar2) {
      dVar4 = exp(dVar2);
      return dVar4;
    }
  }
  else {
    dVar1 = hcephes_gamma(dVar1);
    dVar3 = hcephes_gamma(a);
    dVar5 = hcephes_gamma(b);
    dVar4 = pow(x,a);
    dVar4 = dVar4 * dVar2 * (dVar1 / (dVar5 * dVar3));
  }
  return dVar4;
}

Assistant:

static double hcephes_pseries(double a, double b, double x) {
    double s, t, u, v, n, t1, z, ai;

    ai = 1.0 / a;
    u = (1.0 - b) * x;
    v = u / (a + 1.0);
    t1 = v;
    t = u;
    n = 2.0;
    s = 0.0;
    z = HCEPHES_MACHEP * ai;
    while (fabs(v) > z) {
        u = (n - b) * x / n;
        t *= u;
        v = t / (a + n);
        s += v;
        n += 1.0;
    }
    s += t1;
    s += ai;

    u = a * log(x);
    if ((a + b) < MAXGAM && fabs(u) < HCEPHES_MAXLOG) {
        t = hcephes_gamma(a + b) / (hcephes_gamma(a) * hcephes_gamma(b));
        s = s * t * pow(x, a);
    } else {
        t = hcephes_lgam(a + b) - hcephes_lgam(a) - hcephes_lgam(b) + u + log(s);
        if (t < HCEPHES_MINLOG)
            s = 0.0;
        else
            s = exp(t);
    }
    return (s);
}